

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quick_status_code_from_enum.hpp
# Opt level: O0

bool __thiscall
system_error2::_quick_status_code_from_enum_domain<another_namespace::AnotherCodeWithPayload>::
_do_failure(_quick_status_code_from_enum_domain<another_namespace::AnotherCodeWithPayload> *this,
           status_code<void> *code)

{
  bool bVar1;
  status_code_domain *this_00;
  value_type *pvVar2;
  mapping *pmVar3;
  const_iterator peVar4;
  size_t extraout_RDX;
  value_type v;
  errc ec;
  const_iterator __end0;
  const_iterator __begin0;
  initializer_list<system_error2::errc> *__range3;
  mapping *mapping;
  status_code<void> *code_local;
  _quick_status_code_from_enum_domain<another_namespace::AnotherCodeWithPayload> *this_local;
  
  this_00 = status_code<void>::domain(code);
  bVar1 = status_code_domain::operator==(this_00,&this->super_status_code_domain);
  if (!bVar1) {
    __assert_fail("code.domain() == *this",
                  "/workspace/llm4binary/github/license_c_cmakelists/ned14[P]status-code/include/status-code/quick_status_code_from_enum.hpp"
                  ,0x7b,
                  "virtual bool system_error2::_quick_status_code_from_enum_domain<another_namespace::AnotherCodeWithPayload>::_do_failure(const status_code<void> &) const [Enum = another_namespace::AnotherCodeWithPayload]"
                 );
  }
  pvVar2 = detail::
           status_code_storage<system_error2::_quick_status_code_from_enum_domain<another_namespace::AnotherCodeWithPayload>_>
           ::value((status_code_storage<system_error2::_quick_status_code_from_enum_domain<another_namespace::AnotherCodeWithPayload>_>
                    *)code);
  v.additional_payload = extraout_RDX;
  v.code = pvVar2->additional_payload;
  pmVar3 = _find_mapping((_quick_status_code_from_enum_domain<another_namespace::AnotherCodeWithPayload>
                          *)pvVar2->code,v);
  if (pmVar3 != (mapping *)0x0) {
    if (pmVar3 != (mapping *)0x0) {
      __end0 = std::initializer_list<system_error2::errc>::begin(&pmVar3->code_mappings);
      peVar4 = std::initializer_list<system_error2::errc>::end(&pmVar3->code_mappings);
      for (; __end0 != peVar4; __end0 = __end0 + 1) {
        if (*__end0 == success) {
          return false;
        }
      }
    }
    return true;
  }
  __assert_fail("mapping != nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/ned14[P]status-code/include/status-code/quick_status_code_from_enum.hpp"
                ,0x7f,
                "virtual bool system_error2::_quick_status_code_from_enum_domain<another_namespace::AnotherCodeWithPayload>::_do_failure(const status_code<void> &) const [Enum = another_namespace::AnotherCodeWithPayload]"
               );
}

Assistant:

virtual bool _do_failure(const status_code<void> &code) const noexcept override
  {
    assert(code.domain() == *this);  // NOLINT
    // If `errc::success` is in the generic code mapping, it is not a failure
    const auto *mapping = _find_mapping(static_cast<const quick_status_code_from_enum_code<value_type> &>(code).value());
#if SYSTEM_ERROR2_QUICK_STATUS_CODE_FROM_ENUM_ASSERT_ON_MISSING_MAPPING_TABLE_ENTRIES
    assert(mapping != nullptr);  // if this fires, you forgot to add the enum to the mapping table
#endif
    if(mapping != nullptr)
    {
      for(errc ec : mapping->code_mappings)
      {
        if(ec == errc::success)
        {
          return false;
        }
      }
    }
    return true;
  }